

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads.cpp
# Opt level: O1

void receive_wkr(VIface *iface)

{
  initializer_list<viface::VIface_*> __l;
  dispatcher_cb mycb;
  MyDispatcher printer;
  set<viface::VIface_*,_std::less<viface::VIface_*>,_std::allocator<viface::VIface_*>_> ifaces;
  allocator_type local_99;
  _Any_data local_98;
  code *local_88;
  code *pcStack_80;
  undefined4 local_6c;
  _Any_data local_68;
  code *local_58;
  _Rb_tree<viface::VIface_*,_viface::VIface_*,_std::_Identity<viface::VIface_*>,_std::less<viface::VIface_*>,_std::allocator<viface::VIface_*>_>
  local_48;
  
  __l._M_len = 1;
  __l._M_array = (iterator)&local_98;
  local_98._M_unused._0_8_ = (undefined8)iface;
  std::set<viface::VIface_*,_std::less<viface::VIface_*>,_std::allocator<viface::VIface_*>_>::set
            ((set<viface::VIface_*,_std::less<viface::VIface_*>,_std::allocator<viface::VIface_*>_>
              *)&local_48,__l,(less<viface::VIface_*> *)&local_6c,&local_99);
  local_6c = 0;
  local_88 = (code *)0x0;
  pcStack_80 = (code *)0x0;
  local_98._M_unused._M_object = (void *)0x0;
  local_98._8_8_ = 0;
  local_98._M_unused._M_object = operator_new(0x18);
  *(code **)local_98._M_unused._0_8_ = MyDispatcher::handler;
  *(undefined8 *)((long)local_98._M_unused._0_8_ + 8) = 0;
  *(less<viface::VIface_*> **)((long)local_98._M_unused._0_8_ + 0x10) =
       (less<viface::VIface_*> *)&local_6c;
  pcStack_80 = std::
               _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&),_std::_Bind<bool_(MyDispatcher::*(MyDispatcher_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>_>
               ::_M_invoke;
  local_88 = std::
             _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&),_std::_Bind<bool_(MyDispatcher::*(MyDispatcher_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>_>
             ::_M_manager;
  if (quit == 0) {
    do {
      std::
      function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
      ::function((function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
                  *)&local_68,
                 (function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
                  *)&local_98);
      viface::dispatch(&local_48,&local_68,1000);
      if (local_58 != (code *)0x0) {
        (*local_58)(&local_68,&local_68,__destroy_functor);
      }
    } while (quit == 0);
  }
  if (local_88 != (code *)0x0) {
    (*local_88)(&local_98,&local_98,__destroy_functor);
  }
  std::
  _Rb_tree<viface::VIface_*,_viface::VIface_*,_std::_Identity<viface::VIface_*>,_std::less<viface::VIface_*>,_std::allocator<viface::VIface_*>_>
  ::~_Rb_tree(&local_48);
  return;
}

Assistant:

void receive_wkr(viface::VIface* iface)
{
    set<viface::VIface*> ifaces = {iface};
    MyDispatcher printer;
    viface::dispatcher_cb mycb = bind(
        &MyDispatcher::handler,
        &printer,
        placeholders::_1,
        placeholders::_2,
        placeholders::_3
        );

    while (!quit) {
        // We configure a dispatcher with a timeout of 1 second
        viface::dispatch(ifaces, mycb, 1000);
    }
}